

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_cid.c
# Opt level: O2

int quicly_local_cid_retire(quicly_local_cid_set_t *set,uint64_t sequence,int *_has_pending)

{
  undefined8 uVar1;
  uint64_t uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint64_t uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  uint64_t *puVar16;
  quicly_local_cid_t *pqVar17;
  ulong uVar18;
  ulong uVar19;
  ulong idx;
  bool bVar20;
  bool bVar21;
  
  uVar18 = set->_size;
  puVar16 = &set->cids[0].sequence;
  bVar21 = true;
  idx = uVar18;
  for (uVar19 = 0; uVar18 != uVar19; uVar19 = uVar19 + 1) {
    if (((quicly_local_cid_t *)(puVar16 + -1))->state != QUICLY_LOCAL_CID_STATE_IDLE) {
      if (*puVar16 == sequence) {
        bVar20 = idx != uVar18;
        idx = uVar19;
        if (bVar20) {
          __assert_fail("retired_at == set->_size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/local_cid.c"
                        ,0xbf,
                        "int quicly_local_cid_retire(quicly_local_cid_set_t *, uint64_t, int *)");
        }
      }
      else {
        bVar21 = false;
      }
    }
    puVar16 = puVar16 + 7;
  }
  if (idx != uVar18) {
    if (bVar21) {
      return 0x2000a;
    }
    set->cids[idx].state = QUICLY_LOCAL_CID_STATE_IDLE;
    set->cids[idx].sequence = 0xffffffffffffffff;
    pqVar17 = set->cids + idx + 1;
    for (; (idx + 1 < uVar18 && (pqVar17->state == QUICLY_LOCAL_CID_STATE_PENDING));
        pqVar17 = pqVar17 + 1) {
      uVar1 = *(undefined8 *)(pqVar17 + -1);
      uVar2 = *(undefined8 *)((long)(pqVar17 + -1) + 8);
      uVar3 = *(undefined8 *)((long)(pqVar17 + -1) + 0x10);
      uVar4 = *(undefined8 *)((long)(pqVar17 + -1) + 0x18);
      uVar5 = *(undefined8 *)((long)(pqVar17 + -1) + 0x20);
      uVar6 = *(undefined8 *)((long)(pqVar17 + -1) + 0x28);
      uVar7 = *(undefined8 *)((long)(pqVar17 + -1) + 0x30);
      uVar8 = *(undefined8 *)pqVar17;
      uVar9 = pqVar17->sequence;
      uVar10 = *(undefined8 *)(pqVar17->cid).cid;
      uVar11 = *(undefined8 *)((pqVar17->cid).cid + 8);
      uVar12 = *(undefined8 *)((pqVar17->cid).cid + 0x10);
      uVar13 = *(undefined8 *)(pqVar17->stateless_reset_token + 3);
      uVar14 = *(undefined8 *)(pqVar17->stateless_reset_token + 0xb);
      *(undefined8 *)((long)(pqVar17 + -1) + 0x18) = *(undefined8 *)((pqVar17->cid).cid + 8);
      *(undefined8 *)((long)(pqVar17 + -1) + 0x20) = uVar12;
      *(undefined8 *)((long)(pqVar17 + -1) + 0x28) = uVar13;
      *(undefined8 *)((long)(pqVar17 + -1) + 0x30) = uVar14;
      *(undefined8 *)(pqVar17 + -1) = uVar8;
      *(uint64_t *)((long)(pqVar17 + -1) + 8) = uVar9;
      *(undefined8 *)((long)(pqVar17 + -1) + 0x10) = uVar10;
      *(undefined8 *)((long)(pqVar17 + -1) + 0x18) = uVar11;
      *(undefined8 *)pqVar17 = uVar1;
      pqVar17->sequence = uVar2;
      *(undefined8 *)(pqVar17->cid).cid = uVar3;
      *(undefined8 *)((pqVar17->cid).cid + 8) = uVar4;
      *(undefined8 *)((pqVar17->cid).cid + 8) = uVar4;
      *(undefined8 *)((pqVar17->cid).cid + 0x10) = uVar5;
      *(undefined8 *)(pqVar17->stateless_reset_token + 3) = uVar6;
      *(undefined8 *)(pqVar17->stateless_reset_token + 0xb) = uVar7;
      uVar18 = set->_size;
      idx = idx + 1;
    }
    iVar15 = generate_cid(set,idx);
    if (iVar15 != 0) {
      do_mark_pending(set,idx);
      bVar21 = true;
      goto LAB_00115b5d;
    }
  }
  bVar21 = set->cids[0].state == QUICLY_LOCAL_CID_STATE_PENDING;
LAB_00115b5d:
  *_has_pending = (uint)bVar21;
  return 0;
}

Assistant:

int quicly_local_cid_retire(quicly_local_cid_set_t *set, uint64_t sequence, int *_has_pending)
{
    /* find the CID to be retired, also check if there is at least one CID that has been issued */
    size_t retired_at = set->_size;
    int becomes_empty = 1;
    for (size_t i = 0; i < set->_size; i++) {
        if (set->cids[i].state == QUICLY_LOCAL_CID_STATE_IDLE)
            continue;
        if (set->cids[i].sequence == sequence) {
            assert(retired_at == set->_size);
            retired_at = i;
        } else {
            becomes_empty = 0;
        }
    }

    /* nothing to do if given CID has been retired already */
    if (retired_at == set->_size) {
        *_has_pending = has_pending(set);
        return 0;
    }

    /* it is a protocol violation for the remote peer to retire the only CID that is available to it */
    if (becomes_empty)
        return QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;

    /* retire given CID */
    set->cids[retired_at].state = QUICLY_LOCAL_CID_STATE_IDLE;
    set->cids[retired_at].sequence = UINT64_MAX;

    /* move following PENDING CIDs to front */
    for (size_t i = retired_at + 1; i < set->_size; i++) {
        if (set->cids[i].state != QUICLY_LOCAL_CID_STATE_PENDING)
            break;
        swap_cids(&set->cids[i], &set->cids[retired_at]);
        retired_at = i;
    }

    /* generate one new CID */
    if (generate_cid(set, retired_at)) {
        do_mark_pending(set, retired_at);
        *_has_pending = 1;
    } else {
        *_has_pending = has_pending(set);
    }

    return 0;
}